

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O3

void __thiscall
dgSphere::SetDimensions
          (dgSphere *this,HaF32 *vertex,HaI32 strideInBytes,HaI32 count,dgMatrix *basis)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  dgTemplateVector<float> dVar10;
  undefined8 uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  float *pfVar22;
  uint uVar23;
  HaI32 i;
  int stride;
  int i_00;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [64];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  dgVector eigen;
  dgTemplateVector<float> local_68;
  undefined1 local_58 [16];
  dgTemplateVector<float> local_40;
  
  stride = strideInBytes >> 2;
  local_68 = _DAT_009d8080;
  if (basis == (dgMatrix *)0x0) {
    InternalSphere::Statistics(this,(dgVector *)&local_40,(dgVector *)&local_68,vertex,count,stride)
    ;
    iVar24 = 0;
    i_00 = 0;
    i = i_00;
LAB_0085685b:
    do {
      i_00 = i_00 + 1;
      if (i_00 != 3) {
        pfVar22 = dgTemplateVector<float>::operator[](&local_40,i);
        local_58 = ZEXT416((uint)*pfVar22);
        pfVar22 = dgTemplateVector<float>::operator[](&local_40,i_00);
        fVar29 = *pfVar22;
        auVar26._0_8_ = local_58._0_8_ ^ 0x8000000080000000;
        auVar26._8_4_ = local_58._8_4_ ^ 0x80000000;
        auVar26._12_4_ = local_58._12_4_ ^ 0x80000000;
        auVar31._0_4_ = -fVar29;
        auVar31._4_4_ = 0x80000000;
        auVar31._8_4_ = 0x80000000;
        auVar31._12_4_ = 0x80000000;
        uVar11 = vcmpss_avx512f(auVar26,local_58,2);
        bVar9 = (bool)((byte)uVar11 & 1);
        auVar25._4_12_ = auVar26._4_12_;
        auVar25._0_4_ = (uint)bVar9 * local_58._0_4_ + (uint)!bVar9 * (local_58._0_4_ ^ 0x80000000);
        uVar11 = vcmpss_avx512f(auVar31,ZEXT416((uint)fVar29),2);
        bVar9 = (bool)((byte)uVar11 & 1);
        auVar27._4_12_ = auVar31._4_12_;
        auVar27._0_4_ = (uint)bVar9 * (int)fVar29 + (uint)!bVar9 * (int)auVar31._0_4_;
        auVar26 = vmaxss_avx(auVar25,auVar27);
        auVar25 = vminss_avx(auVar27,auVar25);
        fVar29 = auVar26._0_4_;
        if (auVar25._0_4_ /
            (float)((uint)(fVar29 < 1e-12) * 0x2b8cbccc + (uint)(fVar29 >= 1e-12) * (int)fVar29) <=
            0.9) goto LAB_0085685b;
        pfVar22 = dgTemplateVector<float>::operator[](&local_68,i);
        *pfVar22 = *pfVar22 + *pfVar22;
        InternalSphere::Statistics
                  (this,(dgVector *)&local_40,(dgVector *)&local_68,vertex,count,stride);
        iVar24 = iVar24 + 1;
        i = -1;
      }
      if ((1 < i) || (i_00 = i + 1, i = i_00, 5 < iVar24)) goto LAB_00856946;
    } while( true );
  }
  fVar29 = (basis->m_front).super_dgTemplateVector<float>.m_y;
  fVar34 = (basis->m_front).super_dgTemplateVector<float>.m_z;
  fVar38 = (basis->m_front).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
       (basis->m_front).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar29;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar34;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar38;
  fVar29 = (basis->m_up).super_dgTemplateVector<float>.m_y;
  fVar34 = (basis->m_up).super_dgTemplateVector<float>.m_z;
  fVar38 = (basis->m_up).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x =
       (basis->m_up).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar29;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar34;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar38;
  fVar29 = (basis->m_right).super_dgTemplateVector<float>.m_y;
  fVar34 = (basis->m_right).super_dgTemplateVector<float>.m_z;
  fVar38 = (basis->m_right).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x =
       (basis->m_right).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar29;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar34;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar38;
  fVar29 = (basis->m_posit).super_dgTemplateVector<float>.m_y;
  fVar34 = (basis->m_posit).super_dgTemplateVector<float>.m_z;
  fVar38 = (basis->m_posit).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x =
       (basis->m_posit).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar29;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar34;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar38;
LAB_00856946:
  if (count < 1) {
    auVar30._8_4_ = 0x501502f9;
    auVar30._0_8_ = 0x501502f9501502f9;
    auVar30._12_4_ = 0x501502f9;
    auVar33._8_4_ = 0xd01502f9;
    auVar33._0_8_ = 0xd01502f9d01502f9;
    auVar33._12_4_ = 0xd01502f9;
    auVar35 = ZEXT464(0x501502f9);
    auVar37 = ZEXT464(0xd01502f9);
  }
  else {
    auVar37 = ZEXT464(0xd01502f9);
    pfVar22 = (float *)(vertex + 2);
    auVar26 = vinsertps_avx((undefined1  [16])
                            (this->super_dgMatrix).m_up.super_dgTemplateVector<float>,
                            ZEXT416((uint)(this->super_dgMatrix).m_right.
                                          super_dgTemplateVector<float>.m_x),0x10);
    auVar25 = vinsertps_avx(*(undefined1 (*) [16])
                             &(this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y,
                            ZEXT416((uint)(this->super_dgMatrix).m_right.
                                          super_dgTemplateVector<float>.m_y),0x10);
    auVar30._8_4_ = 0x501502f9;
    auVar30._0_8_ = 0x501502f9501502f9;
    auVar30._12_4_ = 0x501502f9;
    auVar33._8_4_ = 0xd01502f9;
    auVar33._0_8_ = 0xd01502f9d01502f9;
    auVar33._12_4_ = 0xd01502f9;
    auVar27 = vinsertps_avx(*(undefined1 (*) [16])
                             &(this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z,
                            ZEXT416((uint)(this->super_dgMatrix).m_right.
                                          super_dgTemplateVector<float>.m_z),0x10);
    auVar35 = ZEXT464(0x501502f9);
    do {
      fVar29 = pfVar22[-2];
      fVar34 = pfVar22[-1];
      fVar38 = *pfVar22;
      if ((((NAN(fVar38)) || (0x7f7fffff < (uint)ABS(fVar38))) || (NAN(fVar34))) ||
         ((0x7f7fffff < (uint)ABS(fVar29) || (0x7f7fffff < (uint)ABS(fVar34))))) goto LAB_00856e43;
      auVar48._4_4_ = fVar29;
      auVar48._0_4_ = fVar29;
      auVar48._8_4_ = fVar29;
      auVar48._12_4_ = fVar29;
      auVar47._0_4_ = auVar25._0_4_ * fVar34;
      auVar47._4_4_ = auVar25._4_4_ * fVar34;
      auVar47._8_4_ = auVar25._8_4_ * fVar34;
      auVar47._12_4_ = auVar25._12_4_ * fVar34;
      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * (this->super_dgMatrix).m_front.
                                                        super_dgTemplateVector<float>.m_y)),
                                ZEXT416((uint)fVar29),
                                ZEXT416((uint)(this->super_dgMatrix).m_front.
                                              super_dgTemplateVector<float>.m_x));
      auVar45._4_4_ = fVar38;
      auVar45._0_4_ = fVar38;
      auVar45._8_4_ = fVar38;
      auVar45._12_4_ = fVar38;
      auVar31 = vfmadd213ps_fma(auVar48,auVar26,auVar47);
      auVar47 = vfmadd231ss_fma(auVar39,ZEXT416((uint)fVar38),
                                ZEXT416((uint)(this->super_dgMatrix).m_front.
                                              super_dgTemplateVector<float>.m_z));
      auVar39 = vfmadd213ps_fma(auVar45,auVar27,auVar31);
      auVar31 = vmovshdup_avx(auVar39);
      if ((((NAN(auVar31._0_4_)) ||
           ((0x7f7fffff < (uint)ABS(auVar31._0_4_) || (NAN(auVar39._0_4_))))) ||
          (0x7f7fffff < (auVar47._0_4_ & 0x7fffffff))) || (0x7f7fffff < (uint)ABS(auVar39._0_4_)))
      goto LAB_00856e43;
      auVar31 = vminss_avx(auVar47,auVar35._0_16_);
      auVar35 = ZEXT1664(auVar31);
      auVar30 = vminps_avx(auVar39,auVar30);
      auVar31 = vmaxss_avx(auVar47,auVar37._0_16_);
      auVar37 = ZEXT1664(auVar31);
      auVar33 = vmaxps_avx(auVar39,auVar33);
      pfVar22 = pfVar22 + stride;
      count = count + -1;
    } while (count != 0);
  }
  fVar34 = auVar35._0_4_;
  fVar29 = auVar30._0_4_;
  auVar26 = vmovshdup_avx(auVar30);
  fVar38 = auVar26._0_4_;
  if ((((!NAN(fVar38)) && ((uint)ABS(fVar38) < 0x7f800000)) && (!NAN(fVar29))) &&
     (((uint)ABS(fVar29) < 0x7f800000 && ((uint)ABS(fVar34) < 0x7f800000)))) {
    fVar36 = auVar37._0_4_;
    fVar32 = auVar33._0_4_;
    auVar26 = vmovshdup_avx(auVar33);
    fVar41 = auVar26._0_4_;
    if (((!NAN(fVar41)) && (((uint)ABS(fVar41) < 0x7f800000 && (!NAN(fVar32))))) &&
       (((uint)ABS(fVar36) < 0x7f800000 && ((uint)ABS(fVar32) < 0x7f800000)))) {
      if ((((uint)ABS(fVar36 + fVar34) < 0x7f800000) && ((uint)ABS(fVar32 + fVar29) < 0x7f800000))
         && ((uint)ABS(fVar38 + fVar41) < 0x7f800000)) {
        fVar29 = (fVar32 + fVar29) * 0.5;
        fVar32 = (fVar36 + fVar34) * 0.5;
        fVar38 = (fVar38 + fVar41) * 0.5;
        if ((((uint)ABS(fVar32) < 0x7f800000) && ((uint)ABS(fVar29) < 0x7f800000)) &&
           ((uint)ABS(fVar38) < 0x7f800000)) {
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (this->super_dgMatrix).m_up.
                                                            super_dgTemplateVector<float>.m_z)),
                                    ZEXT416((uint)fVar32),
                                    ZEXT416((uint)(this->super_dgMatrix).m_front.
                                                  super_dgTemplateVector<float>.m_z));
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar38),
                                    ZEXT416((uint)(this->super_dgMatrix).m_right.
                                                  super_dgTemplateVector<float>.m_z));
          fVar41 = auVar26._0_4_ + (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z;
          if (!NAN(fVar41)) {
            uVar1 = (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x;
            uVar5 = (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y;
            uVar2 = (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x;
            uVar6 = (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y;
            auVar44._4_4_ = uVar6;
            auVar44._0_4_ = uVar2;
            auVar44._8_8_ = 0;
            uVar3 = (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x;
            uVar7 = (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y;
            auVar46._4_4_ = uVar7;
            auVar46._0_4_ = uVar3;
            auVar46._8_8_ = 0;
            auVar39._4_4_ = fVar32;
            auVar39._0_4_ = fVar32;
            auVar39._8_4_ = fVar32;
            auVar39._12_4_ = fVar32;
            uVar4 = (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x;
            uVar8 = (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y;
            auVar42._4_4_ = fVar38;
            auVar42._0_4_ = fVar38;
            auVar42._8_4_ = fVar38;
            auVar42._12_4_ = fVar38;
            auVar43._0_4_ = (float)uVar1 * fVar29;
            auVar43._4_4_ = (float)uVar5 * fVar29;
            auVar43._8_4_ = fVar29 * 0.0;
            auVar43._12_4_ = fVar29 * 0.0;
            auVar26 = vfmadd213ps_fma(auVar39,auVar44,auVar43);
            auVar26 = vfmadd213ps_fma(auVar42,auVar46,auVar26);
            auVar40._0_4_ = (float)uVar4 + auVar26._0_4_;
            auVar40._4_4_ = (float)uVar8 + auVar26._4_4_;
            auVar40._8_4_ = auVar26._8_4_ + 0.0;
            auVar40._12_4_ = auVar26._12_4_ + 0.0;
            auVar26 = vmovshdup_avx(auVar40);
            if (!NAN(auVar26._0_4_)) {
              auVar13._8_4_ = 0x7fffffff;
              auVar13._0_8_ = 0x7fffffff7fffffff;
              auVar13._12_4_ = 0x7fffffff;
              auVar26 = vandps_avx512vl(auVar40,auVar13);
              auVar14._8_4_ = 0x7f7fffff;
              auVar14._0_8_ = 0x7f7fffff7f7fffff;
              auVar14._12_4_ = 0x7f7fffff;
              uVar12 = vpcmpgtd_avx512vl(auVar26,auVar14);
              if ((((uVar12 & 1) == 0) && (((uVar12 & 0xf) >> 1 & 1) == 0)) &&
                 ((uint)ABS(fVar41) < 0x7f800000)) {
                auVar26 = vsubps_avx(auVar33,auVar30);
                dVar10 = (dgTemplateVector<float>)vinsertps_avx(auVar40,ZEXT416((uint)fVar41),0x28);
                (this->super_dgMatrix).m_posit.super_dgTemplateVector<float> = dVar10;
                uVar21 = vextractps_avx(auVar26,0);
                uVar23 = vextractps_avx(auVar26,1);
                if ((((uint)ABS(fVar36 - fVar34) < 0x7f800000) &&
                    ((uVar21 & 0x7fffffff) < 0x7f800000)) && ((uVar23 & 0x7fffffff) < 0x7f800000)) {
                  fVar29 = (fVar36 - fVar34) * 0.5;
                  auVar15._8_4_ = 0x3f000000;
                  auVar15._0_8_ = 0x3f0000003f000000;
                  auVar15._12_4_ = 0x3f000000;
                  auVar26 = vmulps_avx512vl(auVar26,auVar15);
                  uVar21 = vextractps_avx(auVar26,0);
                  uVar23 = vextractps_avx(auVar26,1);
                  if ((((uint)ABS(fVar29) < 0x7f800000) && ((uVar21 & 0x7fffffff) < 0x7f800000)) &&
                     ((uVar23 & 0x7fffffff) < 0x7f800000)) {
                    auVar16._8_4_ = 0x3b03126f;
                    auVar16._0_8_ = 0x3b03126f3b03126f;
                    auVar16._12_4_ = 0x3b03126f;
                    auVar27 = vaddps_avx512vl(auVar26,auVar16);
                    fVar29 = fVar29 + 0.002;
                    fVar34 = auVar27._0_4_;
                    auVar26 = vmovshdup_avx(auVar27);
                    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),ZEXT416((uint)fVar29)
                                              ,ZEXT416((uint)fVar29));
                    auVar26 = vfmadd213ss_fma(auVar26,auVar26,auVar25);
                    auVar25 = vsqrtss_avx(auVar26,auVar26);
                    auVar31 = ZEXT416((uint)fVar29);
                    auVar26 = vunpcklps_avx(auVar27,auVar31);
                    auVar26 = vinsertps_avx(auVar26,auVar25,0x30);
                    auVar17._8_4_ = 0x7fffffff;
                    auVar17._0_8_ = 0x7fffffff7fffffff;
                    auVar17._12_4_ = 0x7fffffff;
                    auVar26 = vandps_avx512vl(auVar26,auVar17);
                    auVar18._8_4_ = 0x7f7fffff;
                    auVar18._0_8_ = 0x7f7fffff7f7fffff;
                    auVar18._12_4_ = 0x7f7fffff;
                    uVar12 = vpcmpgtd_avx512vl(auVar26,auVar18);
                    if ((uVar12 & 0xf) == 0) {
                      auVar19._8_4_ = 0x80000000;
                      auVar19._0_8_ = 0x8000000080000000;
                      auVar19._12_4_ = 0x80000000;
                      auVar26 = vxorps_avx512vl(auVar27,auVar19);
                      uVar12 = vcmpps_avx512vl(auVar26,auVar27,2);
                      bVar9 = (bool)((byte)uVar12 & 1);
                      auVar28._0_4_ =
                           (float)((uint)bVar9 * (int)fVar34 | (uint)!bVar9 * auVar26._0_4_);
                      bVar9 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar28._4_4_ = (uint)bVar9 * auVar27._4_4_ | (uint)!bVar9 * auVar26._4_4_;
                      bVar9 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar28._8_4_ = (uint)bVar9 * auVar27._8_4_ | (uint)!bVar9 * auVar26._8_4_;
                      bVar9 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar28._12_4_ = (uint)bVar9 * auVar27._12_4_ | (uint)!bVar9 * auVar26._12_4_;
                      if (!NAN(auVar28._0_4_)) {
                        auVar26 = vmovshdup_avx(auVar28);
                        if (!NAN(auVar26._0_4_) && !NAN(auVar25._0_4_)) {
                          auVar20._8_4_ = 0x80000000;
                          auVar20._0_8_ = 0x8000000080000000;
                          auVar20._12_4_ = 0x80000000;
                          auVar26 = vxorps_avx512vl(auVar31,auVar20);
                          uVar11 = vcmpss_avx512f(auVar26,auVar31,2);
                          bVar9 = (bool)((byte)uVar11 & 1);
                          (this->m_size).super_dgTemplateVector<float>.m_x =
                               (float)((uint)bVar9 * (int)fVar29 + (uint)!bVar9 * auVar26._0_4_);
                          uVar11 = vmovlps_avx(auVar28);
                          (this->m_size).super_dgTemplateVector<float>.m_y = (float)(int)uVar11;
                          (this->m_size).super_dgTemplateVector<float>.m_z =
                               (float)(int)((ulong)uVar11 >> 0x20);
                          (this->m_size).super_dgTemplateVector<float>.m_w = auVar25._0_4_;
                          return;
                        }
                      }
                    }
                    goto LAB_00856e43;
                  }
                }
                goto LAB_00856e62;
              }
            }
          }
          goto LAB_00856e43;
        }
      }
LAB_00856e62:
      __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                    ,0x121,"dgVector::dgVector(const dgTemplateVector<hacd::HaF32> &)");
    }
  }
LAB_00856e43:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

void dgSphere::SetDimensions (const hacd::HaF32 vertex[], hacd::HaI32 strideInBytes, hacd::HaI32 count, const dgMatrix *basis) 
{
	dgVector eigen;
	dgVector scaleVector (hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32(1.0f), hacd::HaF32 (0.0f));

	hacd::HaI32 stride = hacd::HaI32 (strideInBytes / sizeof (hacd::HaF32));
	if (!basis)	{
		InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);

		hacd::HaI32 k = 0;
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (k >= 6) {
				 break;
			}
			for (hacd::HaI32 j = i + 1; j < 3; j ++) {
				hacd::HaF32 aspect = InternalSphere::AspectRatio (eigen[i], eigen[j]);
				if (aspect > hacd::HaF32 (0.9f)) {
					scaleVector[i] *= hacd::HaF32 (2.0f); 
					InternalSphere::Statistics (*this, eigen, scaleVector, vertex, count, stride);
					k ++;
					i = -1;
					break;
				}
			}
		}
	} else {
		*this = *basis;
	}
		
   dgVector min; 
   dgVector max;
   InternalSphere::BoundingBox (*this, vertex, count, stride, min, max);

	dgVector massCenter (max + min);
	massCenter = massCenter.Scale (0.5);
	m_posit = TransformVector (massCenter);

	dgVector dim (max - min);
	dim = dim.Scale (hacd::HaF32(0.5f));
	SetDimensions (dim.m_x + InternalSphere::SPHERE_TOL, 
				   dim.m_y + InternalSphere::SPHERE_TOL, 
				   dim.m_z + InternalSphere::SPHERE_TOL);

}